

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghpattern.cc
# Opt level: O0

Pattern * __thiscall CombinePattern::doAnd(CombinePattern *this,Pattern *b,int4 sa)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  InstructionPattern *in;
  long local_a8;
  long local_90;
  InstructionPattern *newpat;
  ContextPattern *c_1;
  InstructionPattern *i_1;
  InstructionPattern *b3;
  InstructionPattern *i;
  ContextPattern *c;
  CombinePattern *b2;
  CombinePattern *tmp;
  int4 sa_local;
  Pattern *b_local;
  CombinePattern *this_local;
  undefined4 extraout_var_05;
  
  iVar1 = (*b->_vptr_Pattern[8])();
  if (iVar1 == 0) {
    if (b == (Pattern *)0x0) {
      local_90 = 0;
    }
    else {
      local_90 = __dynamic_cast(b,&Pattern::typeinfo,&typeinfo,0);
    }
    if (local_90 == 0) {
      if (b == (Pattern *)0x0) {
        local_a8 = 0;
      }
      else {
        local_a8 = __dynamic_cast(b,&Pattern::typeinfo,&InstructionPattern::typeinfo,0);
      }
      if (local_a8 == 0) {
        iVar1 = (*(this->context->super_DisjointPattern).super_Pattern._vptr_Pattern[5])
                          (this->context,b,0);
        iVar2 = (*(this->instr->super_DisjointPattern).super_Pattern._vptr_Pattern[2])();
        in = (InstructionPattern *)CONCAT44(extraout_var_05,iVar2);
        if (sa < 0) {
          (*(in->super_DisjointPattern).super_Pattern._vptr_Pattern[3])(in,(ulong)(uint)-sa);
        }
        b2 = (CombinePattern *)operator_new(0x18);
        CombinePattern(b2,(ContextPattern *)CONCAT44(extraout_var_04,iVar1),in);
      }
      else {
        iVar1 = (*(this->instr->super_DisjointPattern).super_Pattern._vptr_Pattern[5])
                          (this->instr,local_a8,(ulong)(uint)sa);
        b2 = (CombinePattern *)operator_new(0x18);
        iVar2 = (*(this->context->super_DisjointPattern).super_Pattern._vptr_Pattern[2])();
        CombinePattern(b2,(ContextPattern *)CONCAT44(extraout_var_03,iVar2),
                       (InstructionPattern *)CONCAT44(extraout_var_02,iVar1));
      }
    }
    else {
      iVar1 = (*(this->context->super_DisjointPattern).super_Pattern._vptr_Pattern[5])
                        (this->context,*(undefined8 *)(local_90 + 8),0);
      iVar2 = (*(this->instr->super_DisjointPattern).super_Pattern._vptr_Pattern[5])
                        (this->instr,*(undefined8 *)(local_90 + 0x10),(ulong)(uint)sa);
      b2 = (CombinePattern *)operator_new(0x18);
      CombinePattern(b2,(ContextPattern *)CONCAT44(extraout_var_00,iVar1),
                     (InstructionPattern *)CONCAT44(extraout_var_01,iVar2));
    }
    this_local = b2;
  }
  else {
    iVar1 = (*b->_vptr_Pattern[5])(b,this,(ulong)(uint)-sa);
    this_local = (CombinePattern *)CONCAT44(extraout_var,iVar1);
  }
  return (Pattern *)this_local;
}

Assistant:

Pattern *CombinePattern::doAnd(const Pattern *b,int4 sa) const

{
  CombinePattern *tmp;
  
  if (b->numDisjoint() != 0)
    return b->doAnd(this,-sa);

  const CombinePattern *b2 = dynamic_cast<const CombinePattern *>(b);
  if (b2 != (CombinePattern *)0) {
    ContextPattern *c = (ContextPattern *)context->doAnd(b2->context,0);
    InstructionPattern *i = (InstructionPattern *)instr->doAnd(b2->instr,sa);
    tmp = new CombinePattern(c,i);
  }
  else {
    const InstructionPattern *b3 = dynamic_cast<const InstructionPattern *>(b);
    if (b3 != (const InstructionPattern *)0) {
      InstructionPattern *i = (InstructionPattern *)instr->doAnd(b3,sa);
      tmp = new CombinePattern((ContextPattern *)context->simplifyClone(),i);
    }
    else {			// Must be a ContextPattern
      ContextPattern *c = (ContextPattern *)context->doAnd(b,0);
      InstructionPattern *newpat = (InstructionPattern *) instr->simplifyClone();
      if (sa < 0)
	newpat->shiftInstruction(-sa);
      tmp = new CombinePattern(c,newpat);
    }
  }
  return tmp;
}